

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetHexNumberToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  bool bVar2;
  ReservedChars RVar3;
  byte *pbVar4;
  LiteralType literal_type;
  byte *pbVar5;
  long lVar6;
  
  bVar2 = ReadHexNum(this);
  if (bVar2) {
    pbVar5 = (byte *)this->buffer_end_;
    pbVar4 = (byte *)this->cursor_;
    if ((pbVar4 < pbVar5) && (*pbVar4 == 0x2e)) {
      pbVar4 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar4;
      if (pbVar4 < pbVar5) {
        lVar6 = (ulong)*pbVar4 + 1;
      }
      else {
        lVar6 = 0;
      }
      token_type = First_Literal;
      if ((""[lVar6] & 4U) != 0) {
        bVar2 = ReadHexNum(this);
        if (!bVar2) goto LAB_00131ffc;
        pbVar5 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
      }
    }
    if ((pbVar4 < pbVar5) && ((*pbVar4 == 0x70 || (*pbVar4 == 0x50)))) {
      pbVar1 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar1;
      if ((pbVar1 < pbVar5) && ((*pbVar1 == 0x2d || (*pbVar1 == 0x2b)))) {
        this->cursor_ = (char *)(pbVar4 + 2);
      }
      bVar2 = ReadNum(this);
      RVar3 = ReadReservedChars(this);
      if (!bVar2) goto LAB_00132004;
      if (RVar3 != None) goto LAB_00131ffc;
LAB_00132023:
      token_type = First_Literal;
      literal_type = Hexfloat;
    }
    else {
      RVar3 = ReadReservedChars(this);
      if (RVar3 != None) goto LAB_00131ffc;
      if (token_type == First_Literal) goto LAB_00132023;
      literal_type = Int;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
  }
  else {
LAB_00131ffc:
    ReadReservedChars(this);
LAB_00132004:
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetHexNumberToken(TokenType token_type) {
  if (ReadHexNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsHexDigit(PeekChar()) && !ReadHexNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('p') || MatchChar('P')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Hexfloat);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}